

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void uv__udp_sendmsg(uv_udp_t *handle)

{
  uv__queue *puVar1;
  short sVar2;
  uv__queue *puVar3;
  int iVar4;
  uv__queue *puVar5;
  int *piVar6;
  long *plVar7;
  ulong uVar8;
  ulong uVar9;
  undefined4 uVar10;
  mmsghdr h [20];
  long local_538 [161];
  
  puVar1 = &handle->write_queue;
  if ((handle->write_queue).next == puVar1) {
    return;
  }
  do {
    puVar5 = puVar1->next;
    if (puVar5 == puVar1) {
      uVar8 = 0;
    }
    else {
      plVar7 = local_538;
      uVar9 = 0;
      do {
        if (puVar5 == (uv__queue *)0x0) {
          __assert_fail("q != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/udp.c"
                        ,0x127,"void uv__udp_sendmsg(uv_udp_t *)");
        }
        plVar7[6] = 0;
        plVar7[7] = 0;
        plVar7[4] = 0;
        plVar7[5] = 0;
        plVar7[2] = 0;
        plVar7[3] = 0;
        *plVar7 = 0;
        plVar7[1] = 0;
        if (*(short *)&puVar5[1].next == 0) {
          *plVar7 = 0;
          uVar10 = 0;
        }
        else {
          *plVar7 = (long)(puVar5 + 1);
          sVar2 = *(short *)&puVar5[1].next;
          if (sVar2 == 1) {
            uVar10 = 0x6e;
          }
          else {
            uVar10 = 0x1c;
            if (sVar2 != 10) {
              if (sVar2 != 2) {
                __assert_fail("0 && \"unsupported address family\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/udp.c"
                              ,0x139,"void uv__udp_sendmsg(uv_udp_t *)");
              }
              uVar10 = 0x10;
            }
          }
        }
        *(undefined4 *)(plVar7 + 1) = uVar10;
        plVar7[2] = (long)puVar5[9].prev;
        plVar7[3] = (ulong)*(uint *)&puVar5[9].next;
        uVar8 = uVar9 + 1;
        if (0x12 < uVar9) break;
        puVar5 = puVar5->next;
        plVar7 = plVar7 + 8;
        uVar9 = uVar8;
      } while (puVar5 != puVar1);
    }
    do {
      iVar4 = sendmmsg((handle->io_watcher).fd,local_538,uVar8 & 0xffffffff,0);
      if (iVar4 != -1) break;
      piVar6 = __errno_location();
    } while (*piVar6 == 4);
    if (iVar4 < 1) {
      piVar6 = __errno_location();
      if (*piVar6 == 0xb) {
        return;
      }
      if (*piVar6 == 0x69) {
        return;
      }
      puVar5 = puVar1->next;
      if (puVar5 != puVar1 && uVar8 != 0) {
        uVar9 = 1;
        goto LAB_0015bac4;
      }
      break;
    }
    puVar5 = puVar1->next;
    if (puVar5 != puVar1) {
      uVar8 = 1;
      do {
        if (puVar5 == (uv__queue *)0x0) {
          __assert_fail("q != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/udp.c"
                        ,0x15d,"void uv__udp_sendmsg(uv_udp_t *)");
        }
        puVar5[10].next = (puVar5[9].prev)->prev;
        puVar5->prev->next = puVar5->next;
        puVar5->next->prev = puVar5->prev;
        puVar5->next = &handle->write_completed_queue;
        puVar3 = (handle->write_completed_queue).prev;
        puVar5->prev = puVar3;
        puVar3->next = puVar5;
        (handle->write_completed_queue).prev = puVar5;
        if ((ulong)(long)iVar4 <= uVar8) break;
        puVar5 = (handle->write_queue).next;
        uVar8 = uVar8 + 1;
      } while (puVar5 != puVar1);
    }
  } while (puVar1->next != puVar1);
  goto LAB_0015ba70;
  while( true ) {
    puVar5 = (handle->write_queue).next;
    uVar9 = uVar9 + 1;
    if (puVar5 == puVar1) break;
LAB_0015bac4:
    if (puVar5 == (uv__queue *)0x0) {
      __assert_fail("q != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/udp.c"
                    ,0x14b,"void uv__udp_sendmsg(uv_udp_t *)");
    }
    puVar5[10].next = (uv__queue *)-(long)*piVar6;
    puVar5->prev->next = puVar5->next;
    puVar5->next->prev = puVar5->prev;
    puVar5->next = &handle->write_completed_queue;
    puVar3 = (handle->write_completed_queue).prev;
    puVar5->prev = puVar3;
    puVar3->next = puVar5;
    (handle->write_completed_queue).prev = puVar5;
    if (uVar8 <= uVar9) break;
  }
LAB_0015ba70:
  uv__io_feed(handle->loop,&handle->io_watcher);
  return;
}

Assistant:

static void uv__udp_sendmsg(uv_udp_t* handle) {
#if defined(__linux__) || defined(__FreeBSD__)
  uv_udp_send_t* req;
  struct mmsghdr h[20];
  struct mmsghdr* p;
  struct uv__queue* q;
  ssize_t npkts;
  size_t pkts;
  size_t i;

  if (uv__queue_empty(&handle->write_queue))
    return;

write_queue_drain:
  for (pkts = 0, q = uv__queue_head(&handle->write_queue);
       pkts < ARRAY_SIZE(h) && q != &handle->write_queue;
       ++pkts, q = uv__queue_head(q)) {
    assert(q != NULL);
    req = uv__queue_data(q, uv_udp_send_t, queue);
    assert(req != NULL);

    p = &h[pkts];
    memset(p, 0, sizeof(*p));
    if (req->addr.ss_family == AF_UNSPEC) {
      p->msg_hdr.msg_name = NULL;
      p->msg_hdr.msg_namelen = 0;
    } else {
      p->msg_hdr.msg_name = &req->addr;
      if (req->addr.ss_family == AF_INET6)
        p->msg_hdr.msg_namelen = sizeof(struct sockaddr_in6);
      else if (req->addr.ss_family == AF_INET)
        p->msg_hdr.msg_namelen = sizeof(struct sockaddr_in);
      else if (req->addr.ss_family == AF_UNIX)
        p->msg_hdr.msg_namelen = sizeof(struct sockaddr_un);
      else {
        assert(0 && "unsupported address family");
        abort();
      }
    }
    h[pkts].msg_hdr.msg_iov = (struct iovec*) req->bufs;
    h[pkts].msg_hdr.msg_iovlen = req->nbufs;
  }

  do
    npkts = sendmmsg(handle->io_watcher.fd, h, pkts, 0);
  while (npkts == -1 && errno == EINTR);

  if (npkts < 1) {
    if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
      return;
    for (i = 0, q = uv__queue_head(&handle->write_queue);
         i < pkts && q != &handle->write_queue;
         ++i, q = uv__queue_head(&handle->write_queue)) {
      assert(q != NULL);
      req = uv__queue_data(q, uv_udp_send_t, queue);
      assert(req != NULL);

      req->status = UV__ERR(errno);
      uv__queue_remove(&req->queue);
      uv__queue_insert_tail(&handle->write_completed_queue, &req->queue);
    }
    uv__io_feed(handle->loop, &handle->io_watcher);
    return;
  }

  /* Safety: npkts known to be >0 below. Hence cast from ssize_t
   * to size_t safe.
   */
  for (i = 0, q = uv__queue_head(&handle->write_queue);
       i < (size_t)npkts && q != &handle->write_queue;
       ++i, q = uv__queue_head(&handle->write_queue)) {
    assert(q != NULL);
    req = uv__queue_data(q, uv_udp_send_t, queue);
    assert(req != NULL);

    req->status = req->bufs[0].len;

    /* Sending a datagram is an atomic operation: either all data
     * is written or nothing is (and EMSGSIZE is raised). That is
     * why we don't handle partial writes. Just pop the request
     * off the write queue and onto the completed queue, done.
     */
    uv__queue_remove(&req->queue);
    uv__queue_insert_tail(&handle->write_completed_queue, &req->queue);
  }

  /* couldn't batch everything, continue sending (jump to avoid stack growth) */
  if (!uv__queue_empty(&handle->write_queue))
    goto write_queue_drain;
  uv__io_feed(handle->loop, &handle->io_watcher);
#else  /* __linux__ || ____FreeBSD__ */
  uv_udp_send_t* req;
  struct msghdr h;
  struct uv__queue* q;
  ssize_t size;

  while (!uv__queue_empty(&handle->write_queue)) {
    q = uv__queue_head(&handle->write_queue);
    assert(q != NULL);

    req = uv__queue_data(q, uv_udp_send_t, queue);
    assert(req != NULL);

    memset(&h, 0, sizeof h);
    if (req->addr.ss_family == AF_UNSPEC) {
      h.msg_name = NULL;
      h.msg_namelen = 0;
    } else {
      h.msg_name = &req->addr;
      if (req->addr.ss_family == AF_INET6)
        h.msg_namelen = sizeof(struct sockaddr_in6);
      else if (req->addr.ss_family == AF_INET)
        h.msg_namelen = sizeof(struct sockaddr_in);
      else if (req->addr.ss_family == AF_UNIX)
        h.msg_namelen = sizeof(struct sockaddr_un);
      else {
        assert(0 && "unsupported address family");
        abort();
      }
    }
    h.msg_iov = (struct iovec*) req->bufs;
    h.msg_iovlen = req->nbufs;

    do {
      size = sendmsg(handle->io_watcher.fd, &h, 0);
    } while (size == -1 && errno == EINTR);

    if (size == -1) {
      if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
        break;
    }

    req->status = (size == -1 ? UV__ERR(errno) : size);

    /* Sending a datagram is an atomic operation: either all data
     * is written or nothing is (and EMSGSIZE is raised). That is
     * why we don't handle partial writes. Just pop the request
     * off the write queue and onto the completed queue, done.
     */
    uv__queue_remove(&req->queue);
    uv__queue_insert_tail(&handle->write_completed_queue, &req->queue);
    uv__io_feed(handle->loop, &handle->io_watcher);
  }
#endif  /* __linux__ || ____FreeBSD__ */
}